

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtz.cpp
# Opt level: O1

vm_obj_id_t __thiscall CVmTimeZone::get_name_list(CVmTimeZone *this)

{
  CVmObjPageEntry *this_00;
  ZoneHashEntry *pZVar1;
  vm_datatype_t *pvVar2;
  vm_val_t *pvVar3;
  vm_obj_id_t vVar4;
  ZoneHashEntryLink *pZVar5;
  ulong uVar6;
  size_t sVar7;
  char *__s;
  vm_val_t local_40;
  
  if (this->hashentry_ == (ZoneHashEntry *)0x0) {
    sVar7 = 1;
    if (this->name_ == (char *)0x0) {
      sVar7 = 0;
      if (this->abbr_ != (char *)0x0) {
        sVar7 = (size_t)(*this->abbr_ != '\0');
      }
    }
  }
  else {
    sVar7 = 1;
    for (pZVar5 = this->hashentry_->link_from; pZVar5 != (ZoneHashEntryLink *)0x0;
        pZVar5 = pZVar5->link_nxt) {
      sVar7 = sVar7 + 1;
    }
  }
  vVar4 = CVmObjList::create(0,sVar7);
  pvVar3 = sp_;
  pvVar2 = &sp_->typ;
  sp_ = sp_ + 1;
  *pvVar2 = VM_OBJ;
  (pvVar3->val).obj = vVar4;
  this_00 = G_obj_table_X.pages_[vVar4 >> 0xc] + (vVar4 & 0xfff);
  uVar6 = (ulong)**(ushort **)((long)&this_00->ptr_ + 8);
  if (uVar6 != 0) {
    CVmObjList::cons_clear((CVmObjList *)this_00,0,uVar6 - 1);
  }
  pZVar1 = this->hashentry_;
  if (pZVar1 == (ZoneHashEntry *)0x0) {
    __s = this->name_;
    if (__s == (char *)0x0) {
      __s = this->abbr_;
      if ((__s == (char *)0x0) || (*__s == '\0')) goto LAB_00294a48;
      sVar7 = strlen(__s);
    }
    else {
      sVar7 = strlen(__s);
    }
    local_40.val.obj = CVmObjString::create(0,__s,sVar7);
    local_40.typ = VM_OBJ;
    CVmObjList::cons_set_element((CVmObjList *)this_00,0,&local_40);
  }
  else {
    local_40.val.obj =
         CVmObjString::create
                   (0,(pZVar1->super_CVmHashEntryCI).super_CVmHashEntry.str_,
                    (pZVar1->super_CVmHashEntryCI).super_CVmHashEntry.len_);
    local_40.typ = VM_OBJ;
    CVmObjList::cons_set_element((CVmObjList *)this_00,0,&local_40);
    pZVar5 = this->hashentry_->link_from;
    if (pZVar5 != (ZoneHashEntryLink *)0x0) {
      sVar7 = 1;
      do {
        local_40.val.obj =
             CVmObjString::create
                       (0,(pZVar5->super_ZoneHashEntry).super_CVmHashEntryCI.super_CVmHashEntry.str_
                        ,(pZVar5->super_ZoneHashEntry).super_CVmHashEntryCI.super_CVmHashEntry.len_)
        ;
        local_40.typ = VM_OBJ;
        CVmObjList::cons_set_element((CVmObjList *)this_00,sVar7,&local_40);
        pZVar5 = pZVar5->link_nxt;
        sVar7 = sVar7 + 1;
      } while (pZVar5 != (ZoneHashEntryLink *)0x0);
    }
  }
LAB_00294a48:
  sp_ = sp_ + -1;
  return vVar4;
}

Assistant:

vm_obj_id_t CVmTimeZone::get_name_list(VMG0_) const
{
    /* no names found so far */
    int cnt = 0;

    /* count names, depending on what information we have */
    if (hashentry_ != 0)
    {
        /* the hash entry gives us our primary name */
        cnt += 1;
        
        /* count incoming alias links */
        for (ZoneHashEntryLink *e = hashentry_->link_from ; e != 0 ;
             e = e->link_nxt, ++cnt) ;
    }
    else if (name_ != 0)
    {
        /* we have only the one primary name */
        cnt += 1;
    }
    else if (abbr_ != 0 && abbr_[0] != '\0')
    {
        /* no name, but we at least have an abbreviation we can use in lieu */
        cnt += 1;
    }

    /* allocate the result list; stack it for gc protection */
    vm_obj_id_t lstid = CVmObjList::create(vmg_ FALSE, cnt);
    G_stk->push()->set_obj(lstid);
    CVmObjList *lst = (CVmObjList *)vm_objp(vmg_ lstid);
    lst->cons_clear();

    /* start at index 0 */
    int idx = 0;
    vm_val_t ele;

    /* 
     *   add our primary name - this is our explicit name_ string, our hash
     *   entry name, or our primary abbreviation (in order of priority) 
     */
    if (hashentry_ != 0)
    {
        /* set the name from our hash entry */
        ele.set_obj(CVmObjString::create(
            vmg_ FALSE, hashentry_->getstr(), hashentry_->getlen()));
        lst->cons_set_element(idx++, &ele);

        /* add our aliases */
        for (ZoneHashEntryLink *link = hashentry_->link_from ; link != 0 ;
             link = link->link_nxt)
        {
            ele.set_obj(CVmObjString::create(
                vmg_ FALSE, link->getstr(), link->getlen()));
            lst->cons_set_element(idx++, &ele);
        }
    }
    else if (name_ != 0)
    {
        /* the first item is our primary name */
        ele.set_obj(CVmObjString::create(vmg_ FALSE, name_, strlen(name_)));
        lst->cons_set_element(idx++, &ele);
    }
    else if (abbr_ != 0 && abbr_[0] != '\0')
    {
        /* use our primary abbreviation as our name */
        ele.set_obj(CVmObjString::create(vmg_ FALSE, abbr_, strlen(abbr_)));
        lst->cons_set_element(idx++, &ele);
    }

    /* discard the gc protection */
    G_stk->discard();

    /* return the new list object */
    return lstid;
}